

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O0

ir_function_signature * __thiscall
anon_unknown.dwarf_b1ea9::builtin_builder::_isinf
          (builtin_builder *this,builtin_available_predicate avail,glsl_type *type)

{
  int iVar1;
  ir_variable *var;
  glsl_type *return_type;
  undefined4 extraout_var;
  ir_constant *val;
  ir_expression *val_00;
  ir_return *ir;
  operand local_e8;
  operand local_e0;
  operand local_d8;
  operand local_d0;
  int local_c4;
  undefined1 local_c0 [4];
  int i;
  ir_constant_data infinities;
  ir_factory body;
  ir_function_signature *sig;
  ir_variable *x;
  glsl_type *type_local;
  builtin_available_predicate avail_local;
  builtin_builder *this_local;
  
  var = in_var(this,type,"x");
  return_type = glsl_type::bvec((uint)type->vector_elements);
  body.mem_ctx = new_sig(this,return_type,avail,1,var);
  ir_builder::ir_factory::ir_factory
            ((ir_factory *)(infinities.u + 0x1e),&((ir_function_signature *)body.mem_ctx)->body,
             this->mem_ctx);
  *(byte *)((long)body.mem_ctx + 0x48) = *(byte *)((long)body.mem_ctx + 0x48) & 0xfe | 1;
  local_c4 = 0;
  do {
    if ((int)(uint)type->vector_elements <= local_c4) {
      ir_builder::operand::operand(&local_e0,var);
      iVar1 = ir_builder::abs((int)local_e0.val);
      ir_builder::operand::operand(&local_d8,(ir_rvalue *)CONCAT44(extraout_var,iVar1));
      val = imm(this,type,(ir_constant_data *)local_c0);
      ir_builder::operand::operand(&local_e8,&val->super_ir_rvalue);
      val_00 = ir_builder::equal(local_d8,local_e8);
      ir_builder::operand::operand(&local_d0,&val_00->super_ir_rvalue);
      ir = ir_builder::ret(local_d0);
      ir_builder::ir_factory::emit((ir_factory *)(infinities.u + 0x1e),(ir_instruction *)ir);
      return (ir_function_signature *)body.mem_ctx;
    }
    if (type->field_0x4 == '\x02') {
      *(undefined4 *)(local_c0 + (long)local_c4 * 4) = 0x7f800000;
    }
    else {
      if (type->field_0x4 != '\x04') {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/builtin_functions.cpp"
                      ,0x1529,
                      "ir_function_signature *(anonymous namespace)::builtin_builder::_isinf(builtin_available_predicate, const glsl_type *)"
                     );
      }
      *(undefined8 *)(local_c0 + (long)local_c4 * 8) = 0x7ff0000000000000;
    }
    local_c4 = local_c4 + 1;
  } while( true );
}

Assistant:

ir_function_signature *
builtin_builder::_isinf(builtin_available_predicate avail, const glsl_type *type)
{
   ir_variable *x = in_var(type, "x");
   MAKE_SIG(glsl_type::bvec(type->vector_elements), avail, 1, x);

   ir_constant_data infinities;
   for (int i = 0; i < type->vector_elements; i++) {
      switch (type->base_type) {
      case GLSL_TYPE_FLOAT:
         infinities.f[i] = INFINITY;
         break;
      case GLSL_TYPE_DOUBLE:
         infinities.d[i] = INFINITY;
         break;
      default:
         unreachable("unknown type");
      }
   }

   body.emit(ret(equal(abs(x), imm(type, infinities))));

   return sig;
}